

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functable.h
# Opt level: O0

void __thiscall ICM::FuncTable::insert(FuncTable *this,string *name,string *nameref)

{
  size_t sVar1;
  mapped_type *pmVar2;
  FuncTableUnit local_a8;
  size_t local_28;
  size_t id;
  string *nameref_local;
  string *name_local;
  FuncTable *this_local;
  
  id = (size_t)nameref;
  nameref_local = name;
  name_local = (string *)this;
  local_28 = find(this,nameref);
  if (local_28 != 0) {
    this->count = this->count + 1;
    local_a8.ST.funcdata.
    super__Vector_base<const_ICM::Function::FuncObject_*,_std::allocator<const_ICM::Function::FuncObject_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.ST.funcdata.
    super__Vector_base<const_ICM::Function::FuncObject_*,_std::allocator<const_ICM::Function::FuncObject_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.ST.level.
    super__Vector_base<std::vector<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*,_std::allocator<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*>_>,_std::allocator<std::vector<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*,_std::allocator<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.ST.level.
    super__Vector_base<std::vector<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*,_std::allocator<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*>_>,_std::allocator<std::vector<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*,_std::allocator<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.ST.root._M_t.
    super___uniq_ptr_impl<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>
    ._M_t.
    super__Tuple_impl<0UL,_ICM::Function::SignTree::Node_*,_std::default_delete<ICM::Function::SignTree::Node>_>
    .super__Head_base<0UL,_ICM::Function::SignTree::Node_*,_false>._M_head_impl =
         (__uniq_ptr_data<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>,_true,_true>
          )(__uniq_ptr_impl<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>
            )0x0;
    local_a8.ST.level.
    super__Vector_base<std::vector<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*,_std::allocator<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*>_>,_std::allocator<std::vector<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*,_std::allocator<const_std::vector<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>,_std::allocator<std::unique_ptr<ICM::Function::SignTree::Node,_std::default_delete<ICM::Function::SignTree::Node>_>_>_>_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.func.
    super__Vector_base<ICM::Function::FuncObject,_std::allocator<ICM::Function::FuncObject>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.func.
    super__Vector_base<ICM::Function::FuncObject,_std::allocator<ICM::Function::FuncObject>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.name.field_2._8_8_ = 0;
    local_a8.func.
    super__Vector_base<ICM::Function::FuncObject,_std::allocator<ICM::Function::FuncObject>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.name._M_string_length = 0;
    local_a8.name.field_2._M_allocated_capacity = 0;
    local_a8.id = 0;
    local_a8.name._M_dataplus = (_Alloc_hider)0x0;
    local_a8.name._1_7_ = 0;
    local_a8.ST.funcdata.
    super__Vector_base<const_ICM::Function::FuncObject_*,_std::allocator<const_ICM::Function::FuncObject_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    FuncTableUnit::FuncTableUnit(&local_a8);
    std::vector<ICM::FuncTableUnit,_std::allocator<ICM::FuncTableUnit>_>::push_back
              (&this->data,&local_a8);
    FuncTableUnit::~FuncTableUnit(&local_a8);
    sVar1 = local_28;
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[](&this->keymap,nameref_local);
    *pmVar2 = sVar1;
  }
  return;
}

Assistant:

void insert(const string &name, const string &nameref) {
			size_t id = find(nameref);
			if (id) {
				count++;
				data.push_back(Unit());
				keymap[name] = id;
			}
		}